

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::initialiseForSolve(HEkk *this)

{
  HighsStatus HVar1;
  HEkk *in_RDI;
  byte bVar2;
  byte bVar3;
  HEkk *unaff_retaddr;
  bool dual_feasible;
  bool primal_feasible;
  HighsStatus return_status;
  undefined7 in_stack_00000030;
  bool in_stack_00000037;
  HEkk *in_stack_00000038;
  unsigned_long *in_stack_00000040;
  HighsHashTable<unsigned_long,_void> *in_stack_00000048;
  HEkk *in_stack_00000050;
  bool in_stack_000000b7;
  HighsInt in_stack_000000b8;
  SimplexAlgorithm in_stack_000000bc;
  undefined7 in_stack_000000c0;
  bool in_stack_000000c7;
  HighsInt in_stack_000000c8;
  SimplexAlgorithm in_stack_000000cc;
  HEkk *in_stack_000000d0;
  HEkk *in_stack_000000f0;
  HEkk *in_stack_000001d0;
  undefined2 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff2;
  undefined1 in_stack_fffffffffffffff3;
  
  HVar1 = initialiseSimplexLpBasisAndFactor(in_stack_00000038,in_stack_00000037);
  updateSimplexOptions(in_RDI);
  initialiseSimplexLpRandomVectors(in_stack_00000050);
  initialisePartitionedRowwiseMatrix(unaff_retaddr);
  allocateWorkAndBaseArrays
            ((HEkk *)CONCAT44(HVar1,CONCAT13(in_stack_fffffffffffffff3,
                                             CONCAT12(in_stack_fffffffffffffff2,
                                                      in_stack_fffffffffffffff0))));
  initialiseCost((HEkk *)CONCAT17(in_stack_000000c7,in_stack_000000c0),in_stack_000000bc,
                 in_stack_000000b8,in_stack_000000b7);
  initialiseBound(in_stack_000000d0,in_stack_000000cc,in_stack_000000c8,in_stack_000000c7);
  initialiseNonbasicValueAndMove((HEkk *)CONCAT17(in_stack_00000037,in_stack_00000030));
  computePrimal(in_stack_000000f0);
  computeDual(in_stack_000001d0);
  computeSimplexInfeasible
            ((HEkk *)CONCAT44(HVar1,CONCAT13(in_stack_fffffffffffffff3,
                                             CONCAT12(in_stack_fffffffffffffff2,
                                                      in_stack_fffffffffffffff0))));
  computeDualObjectiveValue(this,return_status);
  computePrimalObjectiveValue(this);
  (in_RDI->status_).initialised_for_solve = true;
  bVar2 = (in_RDI->info_).num_primal_infeasibilities == 0;
  bVar3 = (in_RDI->info_).num_dual_infeasibilities == 0;
  HighsHashTable<unsigned_long,_void>::clear
            ((HighsHashTable<unsigned_long,_void> *)
             CONCAT44(HVar1,CONCAT13(bVar2,CONCAT12(bVar3,in_stack_fffffffffffffff0))));
  HighsHashTable<unsigned_long,void>::insert<unsigned_long&>(in_stack_00000048,in_stack_00000040);
  in_RDI->model_status_ = kMin;
  if (((bVar2 & 1) != 0) && ((bVar3 & 1) != 0)) {
    in_RDI->model_status_ = kOptimal;
  }
  return;
}

Assistant:

void HEkk::initialiseForSolve() {
  const HighsStatus return_status = initialiseSimplexLpBasisAndFactor();
  assert(return_status == HighsStatus::kOk);
  assert(status_.has_basis);

  updateSimplexOptions();
  initialiseSimplexLpRandomVectors();
  initialisePartitionedRowwiseMatrix();  // Timed
  allocateWorkAndBaseArrays();
  initialiseCost(SimplexAlgorithm::kPrimal, kSolvePhaseUnknown, false);
  initialiseBound(SimplexAlgorithm::kPrimal, kSolvePhaseUnknown, false);
  initialiseNonbasicValueAndMove();
  computePrimal();                // Timed
  computeDual();                  // Timed
  computeSimplexInfeasible();     // Timed
  computeDualObjectiveValue();    // Timed
  computePrimalObjectiveValue();  // Timed
  status_.initialised_for_solve = true;

  bool primal_feasible = info_.num_primal_infeasibilities == 0;
  bool dual_feasible = info_.num_dual_infeasibilities == 0;
  visited_basis_.clear();
  visited_basis_.insert(basis_.hash);
  model_status_ = HighsModelStatus::kNotset;
  if (primal_feasible && dual_feasible)
    model_status_ = HighsModelStatus::kOptimal;
}